

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBToUV444Row_C(uint8_t *src_argb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  
  if (0 < width) {
    lVar4 = 0;
    do {
      bVar1 = src_argb[lVar4 * 4];
      bVar2 = src_argb[lVar4 * 4 + 1];
      bVar3 = src_argb[lVar4 * 4 + 2];
      dst_u[lVar4] = (uint8_t)(((uint)bVar3 * 0xffda ^ 0x8000) +
                               (uint)bVar2 * 0xffb6 + (uint)bVar1 * 0x70 >> 8);
      dst_v[lVar4] = (uint8_t)(((uint)bVar1 * 0xffee ^ 0x8000) +
                               (uint)bVar2 * 0xffa2 + (uint)bVar3 * 0x70 >> 8);
      lVar4 = lVar4 + 1;
    } while (width != (int)lVar4);
  }
  return;
}

Assistant:

void ARGBToUV444Row_C(const uint8_t* src_argb,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t ab = src_argb[0];
    uint8_t ag = src_argb[1];
    uint8_t ar = src_argb[2];
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
    src_argb += 4;
    dst_u += 1;
    dst_v += 1;
  }
}